

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cc
# Opt level: O2

uint AddBodyFixedJoint(Model *model,uint parent_id,SpatialTransform *joint_frame,Joint *joint,
                      Body *body,string *body_name)

{
  SpatialTransform *this;
  pointer pFVar1;
  pointer pSVar2;
  pointer pFVar3;
  bool bVar4;
  pointer pBVar5;
  ulong uVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  ostream *poVar9;
  long lVar10;
  long lVar11;
  SpatialTransform *pSVar12;
  SpatialTransform *pSVar13;
  Matrix3d *pMVar14;
  char *pcVar15;
  SpatialTransform *pSVar16;
  undefined8 *puVar17;
  Matrix3d *pMVar18;
  uint uVar19;
  byte bVar20;
  SpatialTransform local_2f0;
  Body parent_body;
  SpatialTransform local_220;
  undefined8 local_1c0 [9];
  undefined8 local_178;
  double dStack_170;
  double local_168;
  FixedBody fbody;
  
  bVar20 = 0;
  RigidBodyDynamics::FixedBody::CreateFromBody(&fbody,body);
  this = &fbody.mParentTransform;
  fbody.mMovableParent = parent_id;
  RigidBodyDynamics::Math::SpatialTransform::operator=(this,joint_frame);
  bVar4 = RigidBodyDynamics::Model::IsFixedBodyId(model,parent_id);
  if (bVar4) {
    uVar19 = parent_id - model->fixed_body_discriminator;
    pFVar1 = (model->mFixedBodies).
             super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             .
             super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pFVar3 = pFVar1 + uVar19;
    parent_body.mMass = pFVar3->mMass;
    parent_body.mCenterOfMass.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         *(double *)
          &(pFVar3->mCenterOfMass).super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
    parent_body.mCenterOfMass.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         *(double *)((long)&(pFVar3->mCenterOfMass).super_Vector3d + 8);
    parent_body.mCenterOfMass.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         *(double *)((long)&(pFVar3->mCenterOfMass).super_Vector3d + 0x10);
    lVar11 = 9;
    pMVar14 = &pFVar3->mInertia;
    pMVar18 = &parent_body.mInertia;
    for (lVar10 = lVar11; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pMVar18->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] =
           *(double *)
            &(pMVar14->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>;
      pMVar14 = (Matrix3d *)((long)pMVar14 + ((ulong)bVar20 * -2 + 1) * 8);
      pMVar18 = (Matrix3d *)((long)pMVar18 + (ulong)bVar20 * -0x10 + 8);
    }
    parent_body._104_4_ = pFVar3->mMovableParent;
    pSVar13 = &pFVar1[uVar19].mParentTransform;
    pSVar12 = pSVar13;
    pSVar16 = &local_220;
    for (lVar10 = lVar11; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pSVar16->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = *(double *)&pSVar12->E;
      pSVar12 = (SpatialTransform *)((long)pSVar12 + ((ulong)bVar20 * -2 + 1) * 8);
      pSVar16 = (SpatialTransform *)((long)pSVar16 + (ulong)bVar20 * -0x10 + 8);
    }
    local_220.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] = *(double *)((long)&pSVar13->r + 0x10);
    local_220.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[0] = *(double *)&(pSVar13->r).super_Vector3d;
    local_220.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[1] = *(double *)((long)&pSVar13->r + 8);
    pSVar12 = &pFVar1[uVar19].mBaseTransform;
    puVar17 = local_1c0;
    for (lVar10 = lVar11; lVar10 != 0; lVar10 = lVar10 + -1) {
      *puVar17 = *(undefined8 *)&pSVar12->E;
      pSVar12 = (SpatialTransform *)((long)pSVar12 + ((ulong)bVar20 * -2 + 1) * 8);
      puVar17 = puVar17 + (ulong)bVar20 * -2 + 1;
    }
    local_168 = *(double *)((long)(pSVar13 + 1) + 0x58);
    local_178 = *(undefined8 *)&((Vector3d *)((long)(pSVar13 + 1) + 0x48))->super_Vector3d;
    dStack_170 = *(double *)((long)(pSVar13 + 1) + 0x50);
    fbody.mMovableParent = parent_body._104_4_;
    RigidBodyDynamics::Math::SpatialTransform::operator*(&local_2f0,joint_frame,&local_220);
    pSVar13 = &local_2f0;
    pSVar12 = this;
    for (; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pSVar12->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] =
           (pSVar13->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[0];
      pSVar13 = (SpatialTransform *)((long)pSVar13 + (ulong)bVar20 * -0x10 + 8);
      pSVar12 = (SpatialTransform *)((long)pSVar12 + (ulong)bVar20 * -0x10 + 8);
    }
    fbody.mParentTransform.r.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         local_2f0.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[2];
    fbody.mParentTransform.r.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         local_2f0.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[0];
    fbody.mParentTransform.r.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         local_2f0.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[1];
  }
  pBVar5 = (model->mBodies).
           super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
           .
           super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
           ._M_impl.super__Vector_impl_data._M_start + fbody.mMovableParent;
  parent_body.mMass = pBVar5->mMass;
  parent_body.mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       *(double *)
        &(pBVar5->mCenterOfMass).super_Vector3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
  parent_body.mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       *(double *)((long)&(pBVar5->mCenterOfMass).super_Vector3d + 8);
  parent_body.mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       *(double *)((long)&(pBVar5->mCenterOfMass).super_Vector3d + 0x10);
  pMVar14 = &pBVar5->mInertia;
  pMVar18 = &parent_body.mInertia;
  for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pMVar18->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
    .m_data.array[0] =
         *(double *)
          &(pMVar14->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>;
    pMVar14 = (Matrix3d *)((long)pMVar14 + ((ulong)bVar20 * -2 + 1) * 8);
    pMVar18 = (Matrix3d *)((long)pMVar18 + (ulong)bVar20 * -0x10 + 8);
  }
  parent_body.mIsVirtual = pBVar5->mIsVirtual;
  RigidBodyDynamics::Body::Join(&parent_body,this,body);
  RigidBodyDynamics::Body::operator=
            ((model->mBodies).
             super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
             .
             super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
             ._M_impl.super__Vector_impl_data._M_start + fbody.mMovableParent,&parent_body);
  RigidBodyDynamics::Math::SpatialRigidBodyInertia::createFromMassComInertiaC
            ((SpatialRigidBodyInertia *)&local_2f0,parent_body.mMass,&parent_body.mCenterOfMass,
             &parent_body.mInertia);
  uVar6 = (ulong)fbody.mMovableParent;
  pSVar2 = (model->I).
           super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
           .
           super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2[uVar6].m =
       local_2f0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  *(double *)&pSVar2[uVar6].h.super_Vector3d =
       local_2f0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  *(double *)((long)&pSVar2[uVar6].h.super_Vector3d + 8) =
       local_2f0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  *(double *)((long)&pSVar2[uVar6].h.super_Vector3d + 0x10) =
       local_2f0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[3];
  pSVar2[uVar6].Ixx =
       local_2f0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[4];
  (&pSVar2[uVar6].Ixx)[1] =
       local_2f0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[5];
  pSVar2[uVar6].Iyy =
       local_2f0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[6];
  (&pSVar2[uVar6].Iyy)[1] =
       local_2f0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[7];
  pSVar2[uVar6].Izy =
       local_2f0.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[8];
  (&pSVar2[uVar6].Izy)[1] =
       local_2f0.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[0];
  std::vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
  ::push_back(&(model->mFixedBodies).
               super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
              ,&fbody);
  uVar6 = ((long)(model->mFixedBodies).
                 super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                 .
                 super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(model->mFixedBodies).
                super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                .
                super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x130;
  uVar19 = model->fixed_body_discriminator;
  if (uVar6 <= ~uVar19) {
    if (body_name->_M_string_length != 0) {
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ::find(&(model->mBodyNameMap)._M_t,body_name);
      if ((_Rb_tree_header *)iVar7._M_node !=
          &(model->mBodyNameMap)._M_t._M_impl.super__Rb_tree_header) {
        poVar9 = std::operator<<((ostream *)&std::cerr,"Error: Body with name \'");
        poVar9 = std::operator<<(poVar9,(string *)body_name);
        pcVar15 = "\' already exists!";
        goto LAB_0013cec0;
      }
      pFVar3 = (model->mFixedBodies).
               super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               .
               super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pFVar1 = (model->mFixedBodies).
               super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               .
               super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar19 = model->fixed_body_discriminator;
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[](&model->mBodyNameMap,body_name);
      *pmVar8 = ((int)(((long)pFVar3 - (long)pFVar1) / 0x130) + uVar19) - 1;
      uVar19 = model->fixed_body_discriminator;
      uVar6 = ((long)(model->mFixedBodies).
                     super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                     .
                     super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model->mFixedBodies).
                    super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                    .
                    super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x130;
    }
    return ((int)uVar6 + uVar19) - 1;
  }
  poVar9 = std::operator<<((ostream *)&std::cerr,"Error: cannot add more than ");
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  pcVar15 = " fixed bodies. You need to modify Model::fixed_body_discriminator for this.";
LAB_0013cec0:
  poVar9 = std::operator<<(poVar9,pcVar15);
  std::endl<char,std::char_traits<char>>(poVar9);
  abort();
}

Assistant:

unsigned int AddBodyFixedJoint (
		Model &model,
		const unsigned int parent_id,
		const SpatialTransform &joint_frame,
		const Joint &joint,
		const Body &body,
		std::string body_name) {
	FixedBody fbody = FixedBody::CreateFromBody (body);
	fbody.mMovableParent = parent_id;
	fbody.mParentTransform = joint_frame;

	if (model.IsFixedBodyId(parent_id)) {
		FixedBody fixed_parent = model.mFixedBodies[parent_id - model.fixed_body_discriminator];

		fbody.mMovableParent = fixed_parent.mMovableParent;
		fbody.mParentTransform = joint_frame * fixed_parent.mParentTransform;
	}

	// merge the two bodies
	Body parent_body = model.mBodies[fbody.mMovableParent];
	parent_body.Join (fbody.mParentTransform, body);
	model.mBodies[fbody.mMovableParent] = parent_body;
	model.I[fbody.mMovableParent] = SpatialRigidBodyInertia::createFromMassComInertiaC (parent_body.mMass, parent_body.mCenterOfMass, parent_body.mInertia);

	model.mFixedBodies.push_back (fbody);

	if (model.mFixedBodies.size() > std::numeric_limits<unsigned int>::max() - model.fixed_body_discriminator) {
		std::cerr << "Error: cannot add more than " << std::numeric_limits<unsigned int>::max() - model.mFixedBodies.size() << " fixed bodies. You need to modify Model::fixed_body_discriminator for this." << std::endl;
		assert (0);
		abort();
	}

	if (body_name.size() != 0) {
		if (model.mBodyNameMap.find(body_name) != model.mBodyNameMap.end()) {
			std::cerr << "Error: Body with name '" << body_name << "' already exists!" << std::endl;
			assert (0);
			abort();
		}
		model.mBodyNameMap[body_name] = model.mFixedBodies.size() + model.fixed_body_discriminator - 1;
	}

	return model.mFixedBodies.size() + model.fixed_body_discriminator - 1;
}